

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<11,_10,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Matrix<float,_4,_3> *extraout_RDX;
  Matrix<float,_4,_3> *extraout_RDX_00;
  Matrix<float,_4,_3> *mat;
  Matrix<float,_4,_3> *mat_00;
  VecAccess<float,_4,_3> local_f0;
  Matrix<float,_4,_3> local_d8;
  Vector<float,_3> local_a8 [2];
  Matrix<float,_4,_3> local_90;
  Vector<float,_3> local_60;
  Vector<float,_3> local_54;
  undefined1 local_48 [8];
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  in0.m_data.m_data[2].m_data[2] = (float)in1Type;
  in0.m_data.m_data[2].m_data[3] = (float)in0Type;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,10>
              ((Mat3x4 *)local_48,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
    mat = extraout_RDX;
  }
  else {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<0,10>
              ((Mat3x4 *)local_48,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
    mat = extraout_RDX_00;
  }
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,4,3>
            (&local_90,(MatrixCaseUtils *)local_48,mat);
  reduceToVec3((MatrixCaseUtils *)&local_60,&local_90);
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,4,3>
            (&local_d8,(MatrixCaseUtils *)local_48,mat_00);
  reduceToVec3((MatrixCaseUtils *)local_a8,&local_d8);
  tcu::operator+((tcu *)&local_54,&local_60,local_a8);
  tcu::Vector<float,_4>::xyz(&local_f0,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_f0,&local_54);
  tcu::Matrix<float,_4,_3>::~Matrix(&local_d8);
  tcu::Matrix<float,_4,_3>::~Matrix(&local_90);
  tcu::Matrix<float,_4,_3>::~Matrix((Matrix<float,_4,_3> *)local_48);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(increment(in0)) + reduceToVec3(increment(in0));
	}